

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::sax_parse_internal
          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,json_sax_t *sax)

{
  lexer_t *this_00;
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  byte bVar5;
  undefined1 uVar6;
  token_type tVar7;
  uint uVar8;
  long *plVar10;
  ulong uVar11;
  size_type *psVar12;
  bool bVar13;
  bool bVar14;
  vector<bool,_std::allocator<bool>_> states;
  string local_108;
  undefined1 local_e8 [32];
  parse_error local_c8;
  vector<bool,_std::allocator<bool>_> local_a0;
  string_t *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int iVar9;
  
  bVar13 = false;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00 = &this->m_lexer;
  local_78 = &(this->m_lexer).token_buffer;
  uVar8 = 0;
LAB_00127dd8:
  if (bVar13) {
    bVar13 = false;
    goto LAB_00127e79;
  }
  switch(this->last_token) {
  case literal_true:
    iVar9 = (*sax->_vptr_json_sax[1])(sax,1);
    cVar4 = (char)iVar9;
    break;
  case literal_false:
    iVar9 = (*sax->_vptr_json_sax[1])(sax,0);
    cVar4 = (char)iVar9;
    break;
  case literal_null:
    iVar9 = (**sax->_vptr_json_sax)(sax);
    cVar4 = (char)iVar9;
    break;
  case value_string:
    iVar9 = (*sax->_vptr_json_sax[5])(sax,local_78);
    cVar4 = (char)iVar9;
    break;
  case value_unsigned:
    iVar9 = (*sax->_vptr_json_sax[3])(sax,(this->m_lexer).value_unsigned);
    cVar4 = (char)iVar9;
    break;
  case value_integer:
    iVar9 = (*sax->_vptr_json_sax[2])(sax,(this->m_lexer).value_integer);
    cVar4 = (char)iVar9;
    break;
  case value_float:
    if ((ulong)ABS((this->m_lexer).value_float) < 0x7ff0000000000000) {
      iVar9 = (*sax->_vptr_json_sax[4])(sax,local_78);
      bVar5 = (byte)iVar9;
      uVar8 = (uint)((byte)uVar8 & bVar5);
    }
    else {
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)&local_c8,this_00);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_70,this_00);
      std::operator+(&local_50,"number overflow parsing \'",&local_70);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_108.field_2._M_allocated_capacity = *psVar12;
        local_108.field_2._8_8_ = plVar10[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar12;
        local_108._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_108._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      out_of_range::create((out_of_range *)local_e8,0x196,&local_108);
      uVar8 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,&local_c8,local_e8);
      local_e8._0_8_ = &PTR__exception_0019cc68;
      std::runtime_error::~runtime_error((runtime_error *)(local_e8 + 0x10));
      std::exception::~exception((exception *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((undefined1 *)local_c8.super_exception._0_8_ != (undefined1 *)((long)&local_c8 + 0x10U)) {
        operator_delete((void *)local_c8.super_exception._0_8_);
      }
      bVar5 = 0;
    }
    uVar6 = (undefined1)uVar8;
    if (bVar5 == 0) goto LAB_00128293;
    goto LAB_00127e79;
  case begin_array:
    iVar9 = (*sax->_vptr_json_sax[9])(sax,0xffffffffffffffff);
    if ((char)iVar9 == '\0') goto LAB_001282dd;
    tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    this->last_token = tVar7;
    if (tVar7 == end_array) {
      iVar9 = (*sax->_vptr_json_sax[10])(sax);
      cVar4 = (char)iVar9;
      break;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&local_a0,true);
    goto LAB_00127dd8;
  case begin_object:
    iVar9 = (*sax->_vptr_json_sax[6])(sax,0xffffffffffffffff);
    if ((char)iVar9 == '\0') goto LAB_001282dd;
    tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    this->last_token = tVar7;
    if (tVar7 == end_object) {
      iVar9 = (*sax->_vptr_json_sax[8])(sax);
      cVar4 = (char)iVar9;
      break;
    }
    if (tVar7 != value_string) {
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_e8,this_00);
      sVar3 = (this->m_lexer).chars_read;
      exception_message(&local_108,this,value_string);
      parse_error::create(&local_c8,0x65,sVar3,&local_108);
      iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
      uVar6 = (undefined1)iVar9;
      parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
      ::sax_parse_internal();
      goto LAB_00128293;
    }
    iVar9 = (*sax->_vptr_json_sax[7])(sax);
    if ((char)iVar9 == '\0') goto LAB_001282dd;
    tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    this->last_token = tVar7;
    if (tVar7 != name_separator) {
      sVar2 = (this->m_lexer).chars_read;
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_e8,this_00);
      sVar3 = (this->m_lexer).chars_read;
      exception_message(&local_108,this,name_separator);
      parse_error::create(&local_c8,0x65,sVar3,&local_108);
      iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
      uVar6 = (undefined1)iVar9;
      parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
      ::sax_parse_internal();
      goto LAB_00128293;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&local_a0,false);
    tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    goto LAB_00127fab;
  default:
    sVar2 = (this->m_lexer).chars_read;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((string *)local_e8,this_00);
    sVar3 = (this->m_lexer).chars_read;
    exception_message(&local_108,this,literal_or_value);
    parse_error::create(&local_c8,0x65,sVar3,&local_108);
    iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
    uVar6 = (undefined1)iVar9;
    parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::sax_parse_internal();
    goto LAB_00128293;
  case parse_error:
    sVar2 = (this->m_lexer).chars_read;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((string *)local_e8,this_00);
    sVar3 = (this->m_lexer).chars_read;
    exception_message(&local_108,this,uninitialized);
    parse_error::create(&local_c8,0x65,sVar3,&local_108);
    iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
    uVar6 = (undefined1)iVar9;
    parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::sax_parse_internal();
    goto LAB_00128293;
  }
  if (cVar4 != '\0') {
LAB_00127e79:
    if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p ==
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p &&
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset == 0) {
      uVar6 = 1;
      goto LAB_00128293;
    }
    uVar1 = (ulong)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
    uVar11 = (ulong)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
    if (-1 < (long)uVar1) {
      uVar11 = uVar1;
    }
    if ((local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p
         [((long)uVar11 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
         (uVar1 & 0x3f) & 1) == 0) {
      tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      this->last_token = tVar7;
      if (tVar7 == value_separator) {
        tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
        this->last_token = tVar7;
        if (tVar7 != value_string) {
          sVar2 = (this->m_lexer).chars_read;
          lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::get_token_string((string *)local_e8,this_00);
          sVar3 = (this->m_lexer).chars_read;
          exception_message(&local_108,this,value_string);
          parse_error::create(&local_c8,0x65,sVar3,&local_108);
          iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
          uVar6 = (undefined1)iVar9;
          parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
          ::sax_parse_internal();
          goto LAB_00128293;
        }
        iVar9 = (*sax->_vptr_json_sax[7])(sax);
        if ((char)iVar9 != '\0') {
          tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(this_00);
          this->last_token = tVar7;
          if (tVar7 != name_separator) {
            sVar2 = (this->m_lexer).chars_read;
            lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::get_token_string((string *)local_e8,this_00);
            sVar3 = (this->m_lexer).chars_read;
            exception_message(&local_108,this,name_separator);
            parse_error::create(&local_c8,0x65,sVar3,&local_108);
            iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
            uVar6 = (undefined1)iVar9;
            parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            ::sax_parse_internal();
            goto LAB_00128293;
          }
          tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(this_00);
          goto LAB_00127fab;
        }
      }
      else {
        if (tVar7 != end_object) {
          sVar2 = (this->m_lexer).chars_read;
          lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::get_token_string((string *)local_e8,this_00);
          sVar3 = (this->m_lexer).chars_read;
          exception_message(&local_108,this,end_object);
          parse_error::create(&local_c8,0x65,sVar3,&local_108);
          iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
          uVar6 = (undefined1)iVar9;
          parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
          ::sax_parse_internal();
          goto LAB_00128293;
        }
        iVar9 = (*sax->_vptr_json_sax[8])(sax);
        if ((char)iVar9 != '\0') {
          if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset == 0 &&
              local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p ==
              local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p) {
            __assert_fail("not states.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                          ,0x1228,
                          "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(json_sax_t *) [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          goto LAB_0012803d;
        }
      }
    }
    else {
      tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      this->last_token = tVar7;
      if (tVar7 == value_separator) {
        tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
LAB_00127fab:
        this->last_token = tVar7;
        goto LAB_00127dd8;
      }
      if (tVar7 != end_array) {
        sVar2 = (this->m_lexer).chars_read;
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_e8,this_00);
        sVar3 = (this->m_lexer).chars_read;
        exception_message(&local_108,this,end_array);
        parse_error::create(&local_c8,0x65,sVar3,&local_108);
        iVar9 = (*sax->_vptr_json_sax[0xb])(sax,sVar2,local_e8,&local_c8);
        uVar6 = (undefined1)iVar9;
        parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
        ::sax_parse_internal();
        goto LAB_00128293;
      }
      iVar9 = (*sax->_vptr_json_sax[10])(sax);
      if ((char)iVar9 != '\0') {
        if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset == 0 &&
            local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p ==
            local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p) {
          __assert_fail("not states.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                        ,0x11ef,
                        "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(json_sax_t *) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
LAB_0012803d:
        bVar13 = true;
        bVar14 = local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset =
             local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset - 1;
        if (bVar14) {
          local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
          local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p =
               local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p + -1;
        }
        goto LAB_00127dd8;
      }
    }
  }
LAB_001282dd:
  uVar6 = 0;
LAB_00128293:
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (bool)uVar6;
}

Assistant:

bool sax_parse_internal(json_sax_t* sax)
    {
        // stack to remember the hieararchy of structured values we are parsing
        // true = array; false = object
        std::vector<bool> states;
        // value to avoid a goto (see comment where set to true)
        bool skip_to_state_evaluation = false;

        while (true)
        {
            if (not skip_to_state_evaluation)
            {
                // invariant: get_token() was called before each iteration
                switch (last_token)
                {
                    case token_type::begin_object:
                    {
                        if (JSON_UNLIKELY(not sax->start_object()))
                        {
                            return false;
                        }

                        // closing } -> we are done
                        if (get_token() == token_type::end_object)
                        {
                            if (JSON_UNLIKELY(not sax->end_object()))
                            {
                                return false;
                            }
                            break;
                        }

                        // parse key
                        if (JSON_UNLIKELY(last_token != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::value_string)));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->key(m_lexer.get_string())))
                            {
                                return false;
                            }
                        }

                        // parse separator (:)
                        if (JSON_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::name_separator)));
                        }

                        // remember we are now inside an object
                        states.push_back(false);

                        // parse values
                        get_token();
                        continue;
                    }

                    case token_type::begin_array:
                    {
                        if (JSON_UNLIKELY(not sax->start_array()))
                        {
                            return false;
                        }

                        // closing ] -> we are done
                        if (get_token() == token_type::end_array)
                        {
                            if (JSON_UNLIKELY(not sax->end_array()))
                            {
                                return false;
                            }
                            break;
                        }

                        // remember we are now inside an array
                        states.push_back(true);

                        // parse values (no need to call get_token)
                        continue;
                    }

                    case token_type::value_float:
                    {
                        const auto res = m_lexer.get_number_float();

                        if (JSON_UNLIKELY(not std::isfinite(res)))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    out_of_range::create(406, "number overflow parsing '" + m_lexer.get_token_string() + "'"));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->number_float(res, m_lexer.get_string())))
                            {
                                return false;
                            }
                            break;
                        }
                    }

                    case token_type::literal_false:
                    {
                        if (JSON_UNLIKELY(not sax->boolean(false)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_null:
                    {
                        if (JSON_UNLIKELY(not sax->null()))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_true:
                    {
                        if (JSON_UNLIKELY(not sax->boolean(true)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_integer:
                    {
                        if (JSON_UNLIKELY(not sax->number_integer(m_lexer.get_number_integer())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_string:
                    {
                        if (JSON_UNLIKELY(not sax->string(m_lexer.get_string())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_unsigned:
                    {
                        if (JSON_UNLIKELY(not sax->number_unsigned(m_lexer.get_number_unsigned())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::parse_error:
                    {
                        // using "uninitialized" to avoid "expected" message
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::uninitialized)));
                    }

                    default: // the last token was unexpected
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::literal_or_value)));
                    }
                }
            }
            else
            {
                skip_to_state_evaluation = false;
            }

            // we reached this line after we successfully parsed a value
            if (states.empty())
            {
                // empty stack: we reached the end of the hieararchy: done
                return true;
            }
            else
            {
                if (states.back())  // array
                {
                    // comma -> next value
                    if (get_token() == token_type::value_separator)
                    {
                        // parse a new value
                        get_token();
                        continue;
                    }

                    // closing ]
                    if (JSON_LIKELY(last_token == token_type::end_array))
                    {
                        if (JSON_UNLIKELY(not sax->end_array()))
                        {
                            return false;
                        }

                        // We are done with this array. Before we can parse a
                        // new value, we need to evaluate the new state first.
                        // By setting skip_to_state_evaluation to false, we
                        // are effectively jumping to the beginning of this if.
                        assert(not states.empty());
                        states.pop_back();
                        skip_to_state_evaluation = true;
                        continue;
                    }
                    else
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::end_array)));
                    }
                }
                else  // object
                {
                    // comma -> next value
                    if (get_token() == token_type::value_separator)
                    {
                        // parse key
                        if (JSON_UNLIKELY(get_token() != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::value_string)));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->key(m_lexer.get_string())))
                            {
                                return false;
                            }
                        }

                        // parse separator (:)
                        if (JSON_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::name_separator)));
                        }

                        // parse values
                        get_token();
                        continue;
                    }

                    // closing }
                    if (JSON_LIKELY(last_token == token_type::end_object))
                    {
                        if (JSON_UNLIKELY(not sax->end_object()))
                        {
                            return false;
                        }

                        // We are done with this object. Before we can parse a
                        // new value, we need to evaluate the new state first.
                        // By setting skip_to_state_evaluation to false, we
                        // are effectively jumping to the beginning of this if.
                        assert(not states.empty());
                        states.pop_back();
                        skip_to_state_evaluation = true;
                        continue;
                    }
                    else
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::end_object)));
                    }
                }
            }
        }
    }